

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

void huge_repeat_cb(uv_timer_t *handle)

{
  uv_timer_t *handle_local;
  
  if (huge_repeat_cb::ncalls == 0) {
    if (handle != &huge_timer1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c"
              ,0xf9,"handle == &huge_timer1");
      abort();
    }
  }
  else if (handle != &tiny_timer) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-timer.c"
            ,0xfb,"handle == &tiny_timer");
    abort();
  }
  huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
  if (huge_repeat_cb::ncalls == 10) {
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
  }
  return;
}

Assistant:

static void huge_repeat_cb(uv_timer_t* handle) {
  static int ncalls;

  if (ncalls == 0)
    ASSERT(handle == &huge_timer1);
  else
    ASSERT(handle == &tiny_timer);

  if (++ncalls == 10) {
    uv_close((uv_handle_t*) &tiny_timer, NULL);
    uv_close((uv_handle_t*) &huge_timer1, NULL);
  }
}